

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# environment_navxythetalat.cpp
# Opt level: O0

bool __thiscall
EnvironmentNAVXYTHETALATTICE::ReadinMotionPrimitive
          (EnvironmentNAVXYTHETALATTICE *this,SBPL_xytheta_mprimitive *pMotPrim,FILE *fIn)

{
  byte bVar1;
  int iVar2;
  vector<sbpl_xy_theta_pt_t,_std::allocator<sbpl_xy_theta_pt_t>_> *pvVar3;
  size_type sVar4;
  reference pvVar5;
  undefined8 in_RDX;
  long in_RSI;
  long *in_RDI;
  double dVar6;
  double dVar7;
  int endy_c;
  int endx_c;
  int endtheta_c;
  double mp_endtheta_rad;
  double mp_endy_m;
  double mp_endx_m;
  sbpl_xy_theta_pt_t sourcepose;
  sbpl_xy_theta_pt_t intermpose;
  int i;
  float fTemp;
  int numofIntermPoses;
  char sExpected [1024];
  int dTemp;
  char sTemp [1024];
  int local_8d8;
  int local_8d4;
  value_type *in_stack_fffffffffffff738;
  vector<sbpl_xy_theta_pt_t,_std::allocator<sbpl_xy_theta_pt_t>_> *in_stack_fffffffffffff740;
  sbpl_xy_theta_pt_t local_878;
  sbpl_xy_theta_pt_t local_860;
  int local_844;
  float local_840;
  int local_83c;
  char local_838 [1036];
  undefined4 local_42c;
  char local_428 [1032];
  undefined8 local_20;
  long local_18;
  bool local_1;
  
  local_20 = in_RDX;
  local_18 = in_RSI;
  strcpy(local_838,"primID:");
  iVar2 = __isoc99_fscanf(local_20,"%s",local_428);
  if (iVar2 == 0) {
    local_1 = false;
  }
  else {
    iVar2 = strcmp(local_428,local_838);
    if (iVar2 == 0) {
      iVar2 = __isoc99_fscanf(local_20,"%d",local_18);
      if (iVar2 == 1) {
        strcpy(local_838,"startangle_c:");
        iVar2 = __isoc99_fscanf(local_20,"%s",local_428);
        if (iVar2 == 0) {
          local_1 = false;
        }
        else {
          iVar2 = strcmp(local_428,local_838);
          if (iVar2 == 0) {
            iVar2 = __isoc99_fscanf(local_20,"%d",&local_42c);
            if (iVar2 == 0) {
              local_1 = false;
            }
            else {
              *(char *)(local_18 + 4) = (char)local_42c;
              strcpy(local_838,"endpose_c:");
              iVar2 = __isoc99_fscanf(local_20,"%s",local_428);
              if (iVar2 == 0) {
                local_1 = false;
              }
              else {
                iVar2 = strcmp(local_428,local_838);
                if (iVar2 == 0) {
                  bVar1 = (**(code **)(*in_RDI + 0x278))(in_RDI,local_18 + 0xc,local_20);
                  if ((bVar1 & 1) == 0) {
                    local_1 = false;
                  }
                  else {
                    strcpy(local_838,"additionalactioncostmult:");
                    iVar2 = __isoc99_fscanf(local_20,"%s",local_428);
                    if (iVar2 == 0) {
                      local_1 = false;
                    }
                    else {
                      iVar2 = strcmp(local_428,local_838);
                      if (iVar2 == 0) {
                        iVar2 = __isoc99_fscanf(local_20,"%d",&local_42c);
                        if (iVar2 == 1) {
                          *(undefined4 *)(local_18 + 8) = local_42c;
                          if ((*(byte *)((long)in_RDI + 0x17c) & 1) != 0) {
                            strcpy(local_838,"turning_radius:");
                            iVar2 = __isoc99_fscanf(local_20,"%s",local_428);
                            if (iVar2 == 0) {
                              return false;
                            }
                            iVar2 = strcmp(local_428,local_838);
                            if (iVar2 != 0) {
                              return false;
                            }
                            iVar2 = __isoc99_fscanf(local_20,"%f",&local_840);
                            if (iVar2 != 1) {
                              return false;
                            }
                            *(double *)(local_18 + 0x18) = (double)local_840;
                          }
                          strcpy(local_838,"intermediateposes:");
                          iVar2 = __isoc99_fscanf(local_20,"%s",local_428);
                          if (iVar2 == 0) {
                            local_1 = false;
                          }
                          else {
                            iVar2 = strcmp(local_428,local_838);
                            if (iVar2 == 0) {
                              iVar2 = __isoc99_fscanf(local_20,"%d",&local_83c);
                              if (iVar2 == 1) {
                                for (local_844 = 0; local_844 < local_83c; local_844 = local_844 + 1
                                    ) {
                                  sbpl_xy_theta_pt_t::sbpl_xy_theta_pt_t(&local_860);
                                  bVar1 = (**(code **)(*in_RDI + 0x280))(in_RDI,&local_860,local_20)
                                  ;
                                  if ((bVar1 & 1) == 0) {
                                    return false;
                                  }
                                  std::
                                  vector<sbpl_xy_theta_pt_t,_std::allocator<sbpl_xy_theta_pt_t>_>::
                                  push_back(in_stack_fffffffffffff740,in_stack_fffffffffffff738);
                                }
                                sbpl_xy_theta_pt_t::sbpl_xy_theta_pt_t(&local_878);
                                local_878.x = (double)in_RDI[0x14] * 0.0 +
                                              (double)in_RDI[0x14] / 2.0;
                                local_878.y = (double)in_RDI[0x14] * 0.0 +
                                              (double)in_RDI[0x14] / 2.0;
                                local_878.theta =
                                     (double)(**(code **)(*in_RDI + 0x100))
                                                       (in_RDI,*(undefined1 *)(local_18 + 4));
                                pvVar3 = (vector<sbpl_xy_theta_pt_t,_std::allocator<sbpl_xy_theta_pt_t>_>
                                          *)(local_18 + 0x20);
                                dVar6 = local_878.x;
                                sVar4 = std::
                                        vector<sbpl_xy_theta_pt_t,_std::allocator<sbpl_xy_theta_pt_t>_>
                                        ::size((vector<sbpl_xy_theta_pt_t,_std::allocator<sbpl_xy_theta_pt_t>_>
                                                *)(local_18 + 0x20));
                                pvVar5 = std::
                                         vector<sbpl_xy_theta_pt_t,_std::allocator<sbpl_xy_theta_pt_t>_>
                                         ::operator[](pvVar3,sVar4 - 1);
                                dVar7 = local_878.y;
                                dVar6 = dVar6 + pvVar5->x;
                                pvVar3 = (vector<sbpl_xy_theta_pt_t,_std::allocator<sbpl_xy_theta_pt_t>_>
                                          *)(local_18 + 0x20);
                                sVar4 = std::
                                        vector<sbpl_xy_theta_pt_t,_std::allocator<sbpl_xy_theta_pt_t>_>
                                        ::size((vector<sbpl_xy_theta_pt_t,_std::allocator<sbpl_xy_theta_pt_t>_>
                                                *)(local_18 + 0x20));
                                pvVar5 = std::
                                         vector<sbpl_xy_theta_pt_t,_std::allocator<sbpl_xy_theta_pt_t>_>
                                         ::operator[](pvVar3,sVar4 - 1);
                                dVar7 = dVar7 + pvVar5->y;
                                pvVar3 = (vector<sbpl_xy_theta_pt_t,_std::allocator<sbpl_xy_theta_pt_t>_>
                                          *)(local_18 + 0x20);
                                sVar4 = std::
                                        vector<sbpl_xy_theta_pt_t,_std::allocator<sbpl_xy_theta_pt_t>_>
                                        ::size((vector<sbpl_xy_theta_pt_t,_std::allocator<sbpl_xy_theta_pt_t>_>
                                                *)(local_18 + 0x20));
                                pvVar5 = std::
                                         vector<sbpl_xy_theta_pt_t,_std::allocator<sbpl_xy_theta_pt_t>_>
                                         ::operator[](pvVar3,sVar4 - 1);
                                if (dVar6 < 0.0) {
                                  local_8d4 = (int)(dVar6 / (double)in_RDI[0x14]) + -1;
                                }
                                else {
                                  local_8d4 = (int)(dVar6 / (double)in_RDI[0x14]);
                                }
                                if (dVar7 < 0.0) {
                                  local_8d8 = (int)(dVar7 / (double)in_RDI[0x14]) + -1;
                                }
                                else {
                                  local_8d8 = (int)(dVar7 / (double)in_RDI[0x14]);
                                }
                                iVar2 = (**(code **)(*in_RDI + 0x108))(pvVar5->theta);
                                if (((local_8d4 == *(int *)(local_18 + 0xc)) &&
                                    (local_8d8 == *(int *)(local_18 + 0x10))) &&
                                   (iVar2 == *(int *)(local_18 + 0x14))) {
                                  local_1 = true;
                                }
                                else {
                                  local_1 = false;
                                }
                              }
                              else {
                                local_1 = false;
                              }
                            }
                            else {
                              local_1 = false;
                            }
                          }
                        }
                        else {
                          local_1 = false;
                        }
                      }
                      else {
                        local_1 = false;
                      }
                    }
                  }
                }
                else {
                  local_1 = false;
                }
              }
            }
          }
          else {
            local_1 = false;
          }
        }
      }
      else {
        local_1 = false;
      }
    }
    else {
      fflush(_stdout);
      local_1 = false;
    }
  }
  return local_1;
}

Assistant:

bool EnvironmentNAVXYTHETALATTICE::ReadinMotionPrimitive(
    SBPL_xytheta_mprimitive* pMotPrim,
    FILE* fIn)
{
    char sTemp[1024];
    int dTemp;
    char sExpected[1024];
    int numofIntermPoses;
    float fTemp;

    // read in actionID
    strcpy(sExpected, "primID:");
    if (fscanf(fIn, "%s", sTemp) == 0) {
        return false;
    }
    if (strcmp(sTemp, sExpected) != 0) {
        SBPL_ERROR("ERROR: expected %s but got %s\n", sExpected, sTemp);
        fflush(stdout);
        return false;
    }
    if (fscanf(fIn, "%d", &pMotPrim->motprimID) != 1) {
        return false;
    }

    // read in start angle
    strcpy(sExpected, "startangle_c:");
    if (fscanf(fIn, "%s", sTemp) == 0) {
        return false;
    }
    if (strcmp(sTemp, sExpected) != 0) {
        SBPL_ERROR("ERROR: expected %s but got %s\n", sExpected, sTemp);
        return false;
    }
    if (fscanf(fIn, "%d", &dTemp) == 0) {
        SBPL_ERROR("ERROR reading startangle\n");
        return false;
    }
    pMotPrim->starttheta_c = dTemp;

    // read in end pose
    strcpy(sExpected, "endpose_c:");
    if (fscanf(fIn, "%s", sTemp) == 0) {
        return false;
    }
    if (strcmp(sTemp, sExpected) != 0) {
        SBPL_ERROR("ERROR: expected %s but got %s\n", sExpected, sTemp);
        return false;
    }

    if (ReadinCell(&pMotPrim->endcell, fIn) == false) {
        SBPL_ERROR("ERROR: failed to read in endsearchpose\n");
        return false;
    }

    // read in action cost
    strcpy(sExpected, "additionalactioncostmult:");
    if (fscanf(fIn, "%s", sTemp) == 0) {
        return false;
    }
    if (strcmp(sTemp, sExpected) != 0) {
        SBPL_ERROR("ERROR: expected %s but got %s\n", sExpected, sTemp);
        return false;
    }
    if (fscanf(fIn, "%d", &dTemp) != 1) {
        return false;
    }
    pMotPrim->additionalactioncostmult = dTemp;

    if (bUseNonUniformAngles) {
        // read in action turning radius
        strcpy(sExpected, "turning_radius:");
        if (fscanf(fIn, "%s", sTemp) == 0) {
            return false;
        }
        if (strcmp(sTemp, sExpected) != 0) {
            SBPL_ERROR("ERROR: expected %s but got %s\n", sExpected, sTemp);
            return false;
        }
        if (fscanf(fIn, "%f", &fTemp) != 1) {
            return false;
        }
        pMotPrim->turning_radius = fTemp;
    }

    // read in intermediate poses
    strcpy(sExpected, "intermediateposes:");
    if (fscanf(fIn, "%s", sTemp) == 0) {
        return false;
    }
    if (strcmp(sTemp, sExpected) != 0) {
        SBPL_ERROR("ERROR: expected %s but got %s\n", sExpected, sTemp);
        return false;
    }
    if (fscanf(fIn, "%d", &numofIntermPoses) != 1) {
        return false;
    }
    // all intermposes should be with respect to 0,0 as starting pose since it
    // will be added later and should be done after the action is rotated by
    // initial orientation
    for (int i = 0; i < numofIntermPoses; i++) {
        sbpl_xy_theta_pt_t intermpose;
        if (ReadinPose(&intermpose, fIn) == false) {
            SBPL_ERROR("ERROR: failed to read in intermediate poses\n");
            return false;
        }
        pMotPrim->intermptV.push_back(intermpose);
    }

    // Check that the last pose of the motion matches (within lattice
    // resolution) the designated end pose of the primitive
    sbpl_xy_theta_pt_t sourcepose;
    sourcepose.x = DISCXY2CONT(0, EnvNAVXYTHETALATCfg.cellsize_m);
    sourcepose.y = DISCXY2CONT(0, EnvNAVXYTHETALATCfg.cellsize_m);
    sourcepose.theta = DiscTheta2ContNew(pMotPrim->starttheta_c);
    double mp_endx_m = sourcepose.x + pMotPrim->intermptV[pMotPrim->intermptV.size() - 1].x;
    double mp_endy_m = sourcepose.y + pMotPrim->intermptV[pMotPrim->intermptV.size() - 1].y;
    double mp_endtheta_rad = pMotPrim->intermptV[pMotPrim->intermptV.size() - 1].theta;

    int endtheta_c;
    int endx_c = CONTXY2DISC(mp_endx_m, EnvNAVXYTHETALATCfg.cellsize_m);
    int endy_c = CONTXY2DISC(mp_endy_m, EnvNAVXYTHETALATCfg.cellsize_m);
    endtheta_c = ContTheta2DiscNew(mp_endtheta_rad);
    if (endx_c != pMotPrim->endcell.x ||
        endy_c != pMotPrim->endcell.y ||
        endtheta_c != pMotPrim->endcell.theta)
    {
        SBPL_ERROR( "ERROR: incorrect primitive %d with startangle=%d "
                   "last interm point %f %f %f does not match end pose %d %d %d\n",
                   pMotPrim->motprimID, pMotPrim->starttheta_c,
                   pMotPrim->intermptV[pMotPrim->intermptV.size() - 1].x,
                   pMotPrim->intermptV[pMotPrim->intermptV.size() - 1].y,
                   pMotPrim->intermptV[pMotPrim->intermptV.size() - 1].theta,
                   pMotPrim->endcell.x, pMotPrim->endcell.y,
                   pMotPrim->endcell.theta);
        SBPL_FFLUSH(stdout);
        return false;
    }

    return true;
}